

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

PropertyId __thiscall
Js::ParseableFunctionInfo::GetOrAddPropertyIdTracked
          (ParseableFunctionInfo *this,CharacterBuffer<char16_t> *propName)

{
  PropertyId propertyId;
  ScriptContext *this_00;
  bool bVar1;
  PropertyRecord *local_28;
  PropertyRecord *propRecord;
  
  local_28 = (PropertyRecord *)0x0;
  this_00 = (this->super_FunctionProxy).m_scriptContext;
  ScriptContext::GetOrAddPropertyRecord(this_00,propName,&local_28);
  propertyId = local_28->pid;
  bVar1 = ScriptContext::IsTrackedPropertyId(this_00,propertyId);
  if (!bVar1) {
    JsUtil::
    BaseHashSet<const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_const_Js::PropertyRecord_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::Item(&((this->super_FunctionProxy).m_utf8SourceInfo.ptr)->boundedPropertyRecordHashSet,
           &local_28);
  }
  return propertyId;
}

Assistant:

PropertyId
    ParseableFunctionInfo::GetOrAddPropertyIdTracked(JsUtil::CharacterBuffer<WCHAR> const& propName)
    {
        const Js::PropertyRecord* propRecord = nullptr;
        ScriptContext * scriptContext = this->m_scriptContext;
        scriptContext->GetOrAddPropertyRecord(propName, &propRecord);

        PropertyId propertyId = propRecord->GetPropertyId();
        if (!scriptContext->IsTrackedPropertyId(propertyId))
        {
            this->m_utf8SourceInfo->GetBoundedPropertyRecordHashSet()->Item(propRecord);
        }
        return propertyId;
    }